

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O0

void Bac_ManWriteBlifArray2(FILE *pFile,Bac_Ntk_t *p,int iObj)

{
  int iVar1;
  Bac_Ntk_t *p_00;
  char *pcVar2;
  char *pcVar3;
  Bac_Ntk_t *pModel;
  int i;
  int iTerm;
  int iObj_local;
  Bac_Ntk_t *p_local;
  FILE *pFile_local;
  
  p_00 = Bac_BoxNtk(p,iObj);
  for (pModel._4_4_ = 0; iVar1 = Bac_NtkPiNum(p_00), pModel._4_4_ < iVar1;
      pModel._4_4_ = pModel._4_4_ + 1) {
    iVar1 = Bac_NtkPi(p_00,pModel._4_4_);
    pcVar2 = Bac_ObjNameStr(p_00,iVar1);
    iVar1 = Bac_BoxBi(p,iObj,pModel._4_4_);
    pcVar3 = Bac_ObjNameStr(p,iVar1);
    fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar3);
  }
  for (pModel._4_4_ = 0; iVar1 = Bac_NtkPoNum(p_00), pModel._4_4_ < iVar1;
      pModel._4_4_ = pModel._4_4_ + 1) {
    iVar1 = Bac_NtkPo(p_00,pModel._4_4_);
    pcVar2 = Bac_ObjNameStr(p_00,iVar1);
    iVar1 = Bac_BoxBo(p,iObj,pModel._4_4_);
    pcVar3 = Bac_ObjNameStr(p,iVar1);
    fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar3);
  }
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Bac_ManWriteBlifArray2( FILE * pFile, Bac_Ntk_t * p, int iObj )
{
    int iTerm, i;
    Bac_Ntk_t * pModel = Bac_BoxNtk( p, iObj );
    Bac_NtkForEachPi( pModel, iTerm, i )
        fprintf( pFile, " %s=%s", Bac_ObjNameStr(pModel, iTerm), Bac_ObjNameStr(p, Bac_BoxBi(p, iObj, i)) );
    Bac_NtkForEachPo( pModel, iTerm, i )
        fprintf( pFile, " %s=%s", Bac_ObjNameStr(pModel, iTerm), Bac_ObjNameStr(p, Bac_BoxBo(p, iObj, i)) );
    fprintf( pFile, "\n" );
}